

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::TreeEnsembleRegressor::SharedCtor(TreeEnsembleRegressor *this)

{
  TreeEnsembleRegressor *this_local;
  
  memset(&this->treeensemble_,0,0xc);
  this->_cached_size_ = 0;
  return;
}

Assistant:

void TreeEnsembleRegressor::SharedCtor() {
  ::memset(&treeensemble_, 0, reinterpret_cast<char*>(&postevaluationtransform_) -
    reinterpret_cast<char*>(&treeensemble_) + sizeof(postevaluationtransform_));
  _cached_size_ = 0;
}